

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O1

void google::protobuf::Field::SharedDtor(MessageLite *self)

{
  ulong uVar1;
  
  if (((self->_internal_metadata_).ptr_ & 1) != 0) {
    protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>
              (&self->_internal_metadata_);
  }
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 3));
    protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[3]._internal_metadata_);
    protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 4));
    protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[4]._internal_metadata_);
    RepeatedPtrField<google::protobuf::Option>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::Option> *)&self[1]._internal_metadata_);
    return;
  }
  SharedDtor((Field *)&stack0xffffffffffffffe0);
}

Assistant:

inline void Field::SharedDtor(MessageLite& self) {
  Field& this_ = static_cast<Field&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.name_.Destroy();
  this_._impl_.type_url_.Destroy();
  this_._impl_.json_name_.Destroy();
  this_._impl_.default_value_.Destroy();
  this_._impl_.~Impl_();
}